

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cpp
# Opt level: O0

void rw::writeBMP(Image *image,char *filename)

{
  byte val;
  FILE *__stream;
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  uint uVar3;
  void *data;
  undefined2 local_f0;
  uint local_ec;
  int local_b4;
  int local_b0;
  int x;
  int y;
  int32 n;
  uint8 *line;
  int i;
  DIBheader dib;
  BMPheader bmp;
  int32 depth;
  int32 stride;
  int32 pallen;
  uint32 local_40;
  Error _e;
  undefined1 local_30 [8];
  StreamFile file;
  uint8 *p;
  char *filename_local;
  Image *image_local;
  
  StreamFile::StreamFile((StreamFile *)local_30);
  iVar1 = StreamFile::open((StreamFile *)local_30,filename,0x153df2);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    pallen = 0;
    local_40 = 0x80000003;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/bmp.cpp",0xcb);
    __stream = _stderr;
    pcVar2 = dbgsprint(0x80000003,filename);
    fprintf(__stream,"%s\n",pcVar2);
    setError((Error *)&pallen);
  }
  else {
    if (image->depth < 9) {
      local_ec = 0x100;
      if (image->depth == 4) {
        local_ec = 0x10;
      }
    }
    else {
      local_ec = 0;
    }
    if (image->depth == 0x20) {
      local_f0 = 0x18;
    }
    else {
      local_f0 = (undefined2)image->depth;
    }
    dib.bmask._0_2_ = 0x4d42;
    uVar3 = image->height * ((image->width * image->depth) / 8 + 3U & 0xfffffffc);
    dib.amask = uVar3 + 0x36 + local_ec * 4;
    BMPheader::write((BMPheader *)&dib.bmask,(int)local_30,(void *)(ulong)uVar3,(ulong)local_ec);
    line._4_4_ = 0x28;
    i = image->width;
    dib.headerSize = image->height;
    dib.width._0_2_ = 1;
    dib.width._2_2_ = local_f0;
    dib.height = 0;
    dib.numPlanes = 0;
    dib.depth = 0;
    dib.compression = 0xb13;
    dib.imgSize = 0xb13;
    dib.hres = 0;
    dib.vres = 0;
    data = (void *)((long)&line + 4);
    StreamFile::write8((StreamFile *)local_30,data,0x28);
    for (line._0_4_ = 0; (int)line < (int)local_ec; line._0_4_ = (int)line + 1) {
      Stream::writeU8((Stream *)local_30,image->palette[(long)((int)line << 2) + 2]);
      Stream::writeU8((Stream *)local_30,image->palette[(long)((int)line << 2) + 1]);
      Stream::writeU8((Stream *)local_30,image->palette[(int)line << 2]);
      data = (void *)0xff;
      Stream::writeU8((Stream *)local_30,0xff);
    }
    _y = image->pixels + (image->height + -1) * image->stride;
    for (local_b0 = 0; local_b0 < image->height; local_b0 = local_b0 + 1) {
      file.file = _y;
      for (local_b4 = 0; local_b4 < image->width; local_b4 = local_b4 + 1) {
        switch(image->depth) {
        case 4:
          uVar3 = (*file.file & 0xf) << 4 | *(byte *)((long)file.file + 1) & 0xf;
          data = (void *)(ulong)uVar3;
          Stream::writeU8((Stream *)local_30,(uint8)uVar3);
          file.file = (void *)((long)file.file + 2);
          local_b4 = local_b4 + 1;
          break;
        case 8:
          val = *file.file;
          data = (void *)(ulong)val;
          file.file = (void *)((long)file.file + 1);
          Stream::writeU8((Stream *)local_30,val);
          break;
        case 0x10:
          Stream::writeU8((Stream *)local_30,*file.file);
          data = (void *)(ulong)*(byte *)((long)file.file + 1);
          Stream::writeU8((Stream *)local_30,*(byte *)((long)file.file + 1));
          file.file = (void *)((long)file.file + 2);
          break;
        case 0x18:
          Stream::writeU8((Stream *)local_30,*(uint8 *)((long)file.file + 2));
          Stream::writeU8((Stream *)local_30,*(uint8 *)((long)file.file + 1));
          data = (void *)(ulong)*file.file;
          Stream::writeU8((Stream *)local_30,*file.file);
          file.file = (void *)((long)file.file + 3);
          break;
        case 0x20:
          Stream::writeU8((Stream *)local_30,*(uint8 *)((long)file.file + 2));
          Stream::writeU8((Stream *)local_30,*(uint8 *)((long)file.file + 1));
          data = (void *)(ulong)*file.file;
          Stream::writeU8((Stream *)local_30,*file.file);
          file.file = (void *)((long)file.file + 4);
        }
      }
      x = (int)(((long)file.file - (long)_y) % 4);
      while (x != 0) {
        data = (void *)0x0;
        Stream::writeU8((Stream *)local_30,'\0');
        x = x + -1;
      }
      _y = _y + -(long)image->stride;
    }
    StreamFile::close((StreamFile *)local_30,(int)data);
  }
  StreamFile::~StreamFile((StreamFile *)local_30);
  return;
}

Assistant:

void
writeBMP(Image *image, const char *filename)
{
	ASSERTLITTLE;
	uint8 *p;
	StreamFile file;
	if(!file.open(filename, "wb")){
		RWERROR((ERR_FILE, filename));
		return;
	}

	int32 pallen = image->depth > 8  ? 0 :
	               image->depth == 4 ? 16 : 256;
	int32 stride = image->width*image->depth/8;
	int32 depth = image->depth == 32 ? 24 : image->depth;
	stride = stride+3 & ~3;

	// File headers
	BMPheader bmp;
	bmp.magic = 0x4D42;	// BM
	bmp.size = 0x36 + 4*pallen + image->height*stride;
	bmp.reserved[0] = 0;
	bmp.reserved[1] = 0;
	bmp.offset = 0x36 + 4*pallen;
	bmp.write(&file);

	DIBheader dib;
	dib.headerSize = 0x28;
	dib.width = image->width;
	dib.height = image->height;
	dib.numPlanes = 1;
	dib.depth = depth;
	dib.compression = 0;
	dib.imgSize = 0;
	dib.hres = 2835;	// 72dpi
	dib.vres = 2835;	// 72dpi
	dib.paletteLen = 0;
	dib.numImportant = 0;
	file.write8(&dib, dib.headerSize);

	for(int i = 0; i < pallen; i++){
		file.writeU8(image->palette[i*4+2]);
		file.writeU8(image->palette[i*4+1]);
		file.writeU8(image->palette[i*4+0]);
		file.writeU8(0xFF);
	}

	uint8 *line = image->pixels + (image->height-1)*image->stride;
	int32 n;
	for(int y = 0; y < image->height; y++){
		p = line;
		for(int x = 0; x < image->width; x++){
			switch(image->depth){
			case 4:
				file.writeU8((p[0]&0xF)<<4 | (p[1]&0xF));
				p += 2;
				x++;
				break;
			case 8:
				file.writeU8(*p++);
				break;
			case 16:
				file.writeU8(p[0]);
				file.writeU8(p[1]);
				p += 2;
				break;
			case 24:
				file.writeU8(p[2]);
				file.writeU8(p[1]);
				file.writeU8(p[0]);
				p += 3;
				break;
			case 32:
				file.writeU8(p[2]);
				file.writeU8(p[1]);
				file.writeU8(p[0]);
				p += 4;
			}
		}
		n = (p-line) % 4;
		while(n--)
			file.writeU8(0);
		line -= image->stride;
	}

	file.close();
}